

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicOneWorkGroup::Run(BasicOneWorkGroup *this)

{
  bool bVar1;
  BasicOneWorkGroup *this_local;
  
  bVar1 = RunIteration(this,0x10,1,1,0,true);
  if (bVar1) {
    bVar1 = RunIteration(this,8,8,1,1,false);
    if (bVar1) {
      bVar1 = RunIteration(this,4,4,4,2,true);
      if (bVar1) {
        bVar1 = RunIteration(this,1,2,3,3,false);
        if (bVar1) {
          bVar1 = RunIteration(this,0x80,1,1,3,true);
          if (bVar1) {
            bVar1 = RunIteration(this,2,8,8,3,false);
            if (bVar1) {
              bVar1 = RunIteration(this,2,2,0x20,7,true);
              if (bVar1) {
                this_local = (BasicOneWorkGroup *)0x0;
              }
              else {
                this_local = (BasicOneWorkGroup *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (BasicOneWorkGroup *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (BasicOneWorkGroup *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicOneWorkGroup *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicOneWorkGroup *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicOneWorkGroup *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicOneWorkGroup *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!RunIteration(16, 1, 1, 0, true))
			return ERROR;
		if (!RunIteration(8, 8, 1, 1, false))
			return ERROR;
		if (!RunIteration(4, 4, 4, 2, true))
			return ERROR;
		if (!RunIteration(1, 2, 3, 3, false))
			return ERROR;
		if (!RunIteration(128, 1, 1, 3, true))
			return ERROR;
		if (!RunIteration(2, 8, 8, 3, false))
			return ERROR;
		if (!RunIteration(2, 2, 32, 7, true))
			return ERROR;
		return NO_ERROR;
	}